

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O0

void __thiscall HashMap<TypeClass_*>::insert(HashMap<TypeClass_*> *this,uint hash,TypeClass *value)

{
  bool bVar1;
  int iVar2;
  Node **ppNVar3;
  undefined4 extraout_var;
  Node *local_30;
  Node *n;
  uint bucket;
  TypeClass *value_local;
  uint hash_local;
  HashMap<TypeClass_*> *this_local;
  
  bVar1 = SmallArray<HashMap<TypeClass_*>::Node_*,_32U>::empty(&this->freeList);
  if (bVar1) {
    if (this->allocator == (Allocator *)0x0) {
      local_30 = (Node *)ChunkedStackPool<4092>::Allocate(&this->nodePool,0x18);
    }
    else {
      iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
      local_30 = (Node *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    ppNVar3 = SmallArray<HashMap<TypeClass_*>::Node_*,_32U>::back(&this->freeList);
    local_30 = *ppNVar3;
    SmallArray<HashMap<TypeClass_*>::Node_*,_32U>::pop_back(&this->freeList);
  }
  local_30->value = value;
  local_30->hash = hash;
  local_30->next = this->entries[hash & 0x3ff];
  this->entries[hash & 0x3ff] = local_30;
  return;
}

Assistant:

void insert(unsigned int hash, Value value)
	{
		unsigned int bucket = hash & bucketMask;

		Node *n = NULL;

		if(!freeList.empty())
		{
			n = freeList.back();
			freeList.pop_back();
		}
		else
		{
			if(allocator)
				n = (Node*)allocator->alloc(sizeof(Node));
			else
				n = (Node*)nodePool.Allocate(sizeof(Node));
		}

		n->value = value;
		n->hash = hash;
		n->next = entries[bucket];
		entries[bucket] = n;
	}